

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

ptr<asio_service>
nuraft::nuraft_global_mgr::init_asio_service
          (asio_service_options *asio_opt,ptr<logger> *logger_inst)

{
  bool bVar1;
  nuraft_global_mgr *pnVar2;
  mutex_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  asio_service_options *in_RDI;
  ptr<asio_service> pVar4;
  lock_guard<std::mutex> l;
  nuraft_global_mgr *mgr;
  asio_service_options *args;
  
  args = in_RDI;
  pnVar2 = get_instance();
  if (pnVar2 == (nuraft_global_mgr *)0x0) {
    std::shared_ptr<nuraft::asio_service>::shared_ptr
              ((shared_ptr<nuraft::asio_service> *)in_RDI,in_RDX);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)in_RDI,in_RDX);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pnVar2->asio_service_);
    if (bVar1) {
      std::shared_ptr<nuraft::asio_service>::shared_ptr
                ((shared_ptr<nuraft::asio_service> *)in_RDI,
                 (shared_ptr<nuraft::asio_service> *)in_RDX);
    }
    else {
      cs_new<nuraft::asio_service,nuraft::asio_service_options_const&,std::shared_ptr<nuraft::logger>&>
                (args,(shared_ptr<nuraft::logger> *)in_RDI);
      std::shared_ptr<nuraft::asio_service>::operator=
                ((shared_ptr<nuraft::asio_service> *)in_RDI,
                 (shared_ptr<nuraft::asio_service> *)in_RDX);
      std::shared_ptr<nuraft::asio_service>::~shared_ptr
                ((shared_ptr<nuraft::asio_service> *)0x239bcb);
      std::shared_ptr<nuraft::asio_service>::shared_ptr
                ((shared_ptr<nuraft::asio_service> *)in_RDI,
                 (shared_ptr<nuraft::asio_service> *)in_RDX);
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x239c0c);
    _Var3._M_pi = extraout_RDX_00;
  }
  pVar4.super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  pVar4.super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)args;
  return (ptr<asio_service>)
         pVar4.super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<asio_service> nuraft_global_mgr::init_asio_service
                  ( const asio_service_options& asio_opt,
                    ptr<logger> logger_inst )
{
    nuraft_global_mgr* mgr = get_instance();
    if (!mgr) return nullptr;

    std::lock_guard<std::mutex> l(mgr->asio_service_lock_);
    if (mgr->asio_service_) return mgr->asio_service_;

    mgr->asio_service_ = cs_new<asio_service>(asio_opt, logger_inst);
    return mgr->asio_service_;
}